

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffers_1 asio::buffer(const_buffer *b,size_t max_size_in_bytes)

{
  const_buffers_1 *pcVar1;
  const_buffers_1 *in_RSI;
  const_buffer *in_RDI;
  void *in_stack_ffffffffffffffc8;
  const_buffer local_10;
  
  const_buffer::data(in_RDI);
  pcVar1 = (const_buffers_1 *)const_buffer::size(in_RDI);
  if (pcVar1 < in_RSI) {
    in_RSI = (const_buffers_1 *)const_buffer::size(in_RDI);
  }
  const_buffers_1::const_buffers_1(in_RSI,in_stack_ffffffffffffffc8,0x18ddad);
  return (const_buffers_1)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_CONST_BUFFER buffer(
    const const_buffer& b,
    std::size_t max_size_in_bytes) ASIO_NOEXCEPT
{
  return ASIO_CONST_BUFFER(b.data(),
      b.size() < max_size_in_bytes
      ? b.size() : max_size_in_bytes
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}